

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_wakeupvm(HSQUIRRELVM v,SQBool wakeupret,SQBool retval,SQBool raiseerror,
                    SQBool throwerror)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  long lVar4;
  SQTable *pSVar5;
  bool bVar6;
  SQObjectPtr *pSVar7;
  SQObjectPtr *pSVar8;
  SQRESULT SVar9;
  SQObjectPtr ret;
  SQObjectPtr dummy;
  SQObjectPtr local_48;
  SQObjectPtr local_38;
  
  local_48.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_48.super_SQObject._type = OT_NULL;
  if (v->_suspended == 0) {
    SVar9 = -1;
    sq_throwerror(v,"cannot resume a vm that is not running any code");
  }
  else {
    lVar4 = v->_suspended_target;
    if (wakeupret == 0) {
      if (lVar4 != -1) {
        pSVar7 = SQVM::GetAt(v,lVar4 + v->_stackbase);
        pSVar5 = (pSVar7->super_SQObject)._unVal.pTable;
        SVar2 = (pSVar7->super_SQObject)._type;
        (pSVar7->super_SQObject)._type = OT_NULL;
        (pSVar7->super_SQObject)._unVal.pTable = (SQTable *)0x0;
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
      }
    }
    else {
      if (lVar4 != -1) {
        pSVar7 = SQVM::GetUp(v,-1);
        pSVar8 = SQVM::GetAt(v,v->_suspended_target + v->_stackbase);
        SVar2 = (pSVar8->super_SQObject)._type;
        pSVar5 = (pSVar8->super_SQObject)._unVal.pTable;
        (pSVar8->super_SQObject)._unVal = (pSVar7->super_SQObject)._unVal;
        SVar3 = (pSVar7->super_SQObject)._type;
        (pSVar8->super_SQObject)._type = SVar3;
        if ((SVar3 >> 0x1b & 1) != 0) {
          pSVar1 = &(((pSVar8->super_SQObject)._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((SVar2 >> 0x1b & 1) != 0) {
          pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 - 1;
          if (*pSVar1 == 0) {
            (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted
              [2])();
          }
        }
      }
      SQVM::Pop(v);
    }
    local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_38.super_SQObject._type = OT_NULL;
    SVar9 = -1;
    bVar6 = SQVM::Execute(v,&local_38,-1,-1,&local_48,raiseerror,
                          ET_RESUME_THROW_VM - (throwerror == 0));
    if (bVar6) {
      if (retval != 0) {
        SQVM::Push(v,&local_48);
      }
      SVar9 = 0;
    }
    SQObjectPtr::~SQObjectPtr(&local_38);
  }
  SQObjectPtr::~SQObjectPtr(&local_48);
  return SVar9;
}

Assistant:

SQRESULT sq_wakeupvm(HSQUIRRELVM v,SQBool wakeupret,SQBool retval,SQBool raiseerror,SQBool throwerror)
{
    SQObjectPtr ret;
    if(!v->_suspended)
        return sq_throwerror(v,_SC("cannot resume a vm that is not running any code"));
    SQInteger target = v->_suspended_target;
    if(wakeupret) {
        if(target != -1) {
            v->GetAt(v->_stackbase+v->_suspended_target)=v->GetUp(-1); //retval
        }
        v->Pop();
    } else if(target != -1) { v->GetAt(v->_stackbase+v->_suspended_target).Null(); }
    SQObjectPtr dummy;
    if(!v->Execute(dummy,-1,-1,ret,raiseerror,throwerror?SQVM::ET_RESUME_THROW_VM : SQVM::ET_RESUME_VM)) {
        return SQ_ERROR;
    }
    if(retval)
        v->Push(ret);
    return SQ_OK;
}